

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.h
# Opt level: O0

void __thiscall dynet::CyclicalSGDTrainer::cyclic_update_eta(CyclicalSGDTrainer *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long in_RDI;
  long lVar4;
  float extraout_XMM0_Da;
  undefined8 in_XMM0_Qa;
  __type_conflict1 _Var5;
  float x;
  float cycle;
  undefined4 local_24;
  
  lVar4 = in_RDI;
  std::floor((double)CONCAT44((int)((ulong)in_XMM0_Qa >> 0x20),
                              (float)*(uint *)(in_RDI + 0x40) /
                              (*(float *)(in_RDI + 0x38) + *(float *)(in_RDI + 0x38)) + 1.0));
  std::abs((int)lVar4);
  fVar1 = *(float *)(in_RDI + 0x30);
  if (1.0 - extraout_XMM0_Da <= 0.0) {
    local_24 = 0.0;
  }
  else {
    fVar2 = *(float *)(in_RDI + 0x34);
    fVar3 = *(float *)(in_RDI + 0x30);
    _Var5 = std::pow<float,unsigned_int>(0.0,0xdb806f);
    local_24 = (fVar2 - fVar3) * (1.0 - extraout_XMM0_Da) * (float)_Var5;
  }
  *(float *)(in_RDI + 8) = fVar1 + local_24;
  *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + 1;
  return;
}

Assistant:

void cyclic_update_eta() {
    float cycle = std::floor(1 + ((float) it)  / (2 * step_size));
    float x = std::abs( ((float) it) / step_size - 2 * cycle + 1);
    learning_rate = e_min + ((1 - x) > 0 ? (e_max - e_min) * (1 - x) * (real)std::pow(gamma, it) : 0);
    it++;
  }